

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xcard_mt.cpp
# Opt level: O0

vector<bool,_std::allocator<bool>_> * __thiscall
xcardMT::validateFromFile
          (vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,xcardMT *this,ifstream *fp)

{
  vector<bool,_std::allocator<bool>_> *pvVar1;
  long lVar2;
  native_handle_type nVar3;
  vector<bool,std::allocator<bool>> *pvVar4;
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  int iVar7;
  ostream *poVar8;
  vector<bool,_std::allocator<bool>_> *pvVar9;
  thread *ptVar10;
  thread *ptVar11;
  iterator iVar12;
  iterator iVar13;
  _Bit_iterator __first;
  const_iterator __position;
  native_handle_type nStack_270;
  _Bit_iterator_base _Stack_268;
  undefined1 auStack_258 [32];
  vector<bool,_std::allocator<bool>_> *local_238;
  thread *local_220;
  thread *local_218;
  byte local_20d;
  uint local_20c;
  _Bit_type *local_208;
  byte local_1fa;
  byte local_1f9;
  thread *local_1f8;
  thread *local_1f0;
  thread *local_1e8;
  ulong local_1e0;
  thread *local_1d8;
  ostream *local_1d0;
  ostream *local_1c8;
  ostream *local_1c0;
  ostream *local_1b8;
  vector<bool,_std::allocator<bool>_> *local_1b0;
  vector<bool,_std::allocator<bool>_> *local_1a8;
  vector<bool,_std::allocator<bool>_> *local_1a0;
  ulong local_198;
  vector<bool,_std::allocator<bool>_> *local_190;
  undefined1 local_181;
  istream *local_180;
  vector<bool,_std::allocator<bool>_> *local_178;
  xcardMT *local_170;
  vector<bool,std::allocator<bool>> *local_168;
  int local_15c;
  _Bit_type *local_158;
  uint local_150;
  _Bit_type *local_148;
  uint local_140;
  _Bit_type *local_138;
  uint uStack_130;
  undefined4 uStack_12c;
  _Bit_type *local_128;
  uint local_120;
  _Bit_type *local_118;
  uint local_110;
  _Bit_type *local_108;
  uint local_100;
  _Bit_iterator local_f8;
  undefined1 local_e8 [12];
  ulong local_d8;
  size_t i;
  xcardMT *local_c8;
  code *local_c0;
  undefined8 local_b8;
  thread local_b0;
  int local_a4;
  undefined1 local_a0 [4];
  int pt_counter;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  card_storage;
  size_t thread_id;
  unsigned_long __vla_expr1;
  long per_thread;
  unsigned_long __vla_expr0;
  int local_48;
  int line_counter;
  string buf;
  ifstream *fp_local;
  xcardMT *this_local;
  vector<bool,_std::allocator<bool>_> *final_result;
  
  _Stack_268._8_8_ = 0x112ccc;
  local_178 = __return_storage_ptr__;
  local_170 = this;
  local_168 = (vector<bool,std::allocator<bool>> *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)&line_counter);
  _Stack_268._8_8_ = 0x112cdc;
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)local_168)
  ;
  local_48 = 0;
  while( true ) {
    _Stack_268._8_8_ = 0x112cf0;
    local_180 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)fp,(string *)&line_counter);
    _Stack_268._8_8_ = 0x112d0f;
    local_181 = std::ios::operator_cast_to_bool
                          ((ios *)(local_180 + *(long *)(*(long *)local_180 + -0x18)));
    if (!(bool)local_181) break;
    local_48 = local_48 + 1;
  }
  _Stack_268._8_8_ = 0x112d54;
  std::ios::clear(fp + *(long *)(*(long *)fp + -0x18),0);
  _Stack_268._8_8_ = 0x112d63;
  std::istream::seekg((long)fp,_S_beg);
  if (local_170->max_threads < 1) {
    _Stack_268._8_8_ = 0x112d77;
    iVar7 = std::thread::hardware_concurrency();
    local_170->max_threads = iVar7;
  }
  local_198 = (ulong)(uint)local_170->max_threads;
  lVar2 = -(local_198 * 0x28 + 0xf & 0xfffffffffffffff0);
  pvVar9 = (vector<bool,_std::allocator<bool>_> *)(auStack_258 + lVar2);
  local_190 = pvVar9;
  if (local_198 != 0) {
    local_1a8 = pvVar9 + local_198;
    local_1a0 = pvVar9;
    do {
      pvVar1 = local_1a0;
      local_1b0 = local_1a0;
      *(undefined8 *)(auStack_258 + lVar2 + -8) = 0x112dfe;
      std::vector<bool,_std::allocator<bool>_>::vector(pvVar1);
      local_1a0 = local_1b0 + 1;
    } while (local_1a0 != local_1a8);
  }
  if ((local_170->super_xcard).debug != 0) {
    *(undefined8 *)(auStack_258 + lVar2 + -8) = 0x112e40;
    poVar8 = std::operator<<((ostream *)&std::cout,"[DEBUG] TotalLines=");
    local_1b8 = poVar8;
    *(undefined8 *)(auStack_258 + lVar2 + -8) = 0x112e58;
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_48);
    local_1c0 = poVar8;
    *(undefined8 *)(auStack_258 + lVar2 + -8) = 0x112e74;
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    *(undefined8 *)(auStack_258 + lVar2 + -8) = 0x112e89;
    poVar8 = std::operator<<((ostream *)&std::cout,"[DEBUG] max_threads=");
    iVar7 = local_170->max_threads;
    local_1c8 = poVar8;
    *(undefined8 *)(auStack_258 + lVar2 + -8) = 0x112ea8;
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar7);
    local_1d0 = poVar8;
    *(undefined8 *)(auStack_258 + lVar2 + -8) = 0x112ec4;
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  }
  do {
    iVar7 = local_48 / local_170->max_threads;
    if (iVar7 <= local_170->max_threads) {
      local_170->max_threads = 1;
      iVar7 = local_48;
    }
    local_1e0 = (ulong)(uint)local_170->max_threads;
    ptVar10 = (thread *)((long)pvVar9 - (local_1e0 * 8 + 0xf & 0xfffffffffffffff0));
    local_1d8 = ptVar10;
    if (local_1e0 != 0) {
      local_1f0 = ptVar10 + local_1e0;
      local_1e8 = ptVar10;
      do {
        ptVar11 = local_1e8;
        local_1f8 = local_1e8;
        ptVar10[-1]._M_id._M_thread = 0x112f8b;
        std::thread::thread(ptVar11);
        local_1e8 = local_1f8 + 1;
      } while (local_1e8 != local_1f0);
    }
    for (card_storage.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        card_storage.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage < (pointer)(long)local_170->max_threads;
        card_storage.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             card_storage.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
      ptVar10[-1]._M_id._M_thread = 0x112fd5;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_a0);
      local_a4 = 0;
      while( true ) {
        local_1f9 = 0;
        if (local_a4 < iVar7) {
          ptVar10[-1]._M_id._M_thread = 0x113007;
          local_1fa = std::ios::eof();
          local_1f9 = local_1fa ^ 0xff;
        }
        if ((local_1f9 & 1) == 0) break;
        ptVar10[-1]._M_id._M_thread = 0x113036;
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)fp,(string *)&line_counter);
        ptVar10[-1]._M_id._M_thread = 0x113048;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_a0,(value_type *)&line_counter);
        local_a4 = local_a4 + 1;
      }
      local_c0 = runner;
      local_b8 = 0;
      local_c8 = local_170;
      i = (size_t)(local_190 +
                  (long)card_storage.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ptVar10[-1]._M_id._M_thread = 0x1130e1;
      std::thread::
      thread<void(xcardMT::*)(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<bool,std::allocator<bool>>*),xcardMT*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<bool,std::allocator<bool>>*,void>
                (&local_b0,(type *)&local_c0,&local_c8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_a0,(vector<bool,_std::allocator<bool>_> **)&i);
      ptVar11 = local_1d8 +
                (long)card_storage.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
      ptVar10[-1]._M_id._M_thread = 0x113101;
      std::thread::operator=(ptVar11,&local_b0);
      ptVar10[-1]._M_id._M_thread = 0x11310d;
      std::thread::~thread(&local_b0);
      local_48 = local_48 - local_a4;
      ptVar10[-1]._M_id._M_thread = 0x113127;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_a0);
    }
    for (local_d8 = 0; local_d8 < (ulong)(long)local_170->max_threads; local_d8 = local_d8 + 1) {
      ptVar10[-1]._M_id._M_thread = 0x113175;
      std::thread::join();
      pvVar4 = local_168;
      ptVar10[-1]._M_id._M_thread = 0x113183;
      iVar12 = std::vector<bool,_std::allocator<bool>_>::end
                         ((vector<bool,_std::allocator<bool>_> *)pvVar4);
      local_108 = iVar12.super__Bit_iterator_base._M_p;
      local_100 = iVar12.super__Bit_iterator_base._M_offset;
      local_f8.super__Bit_iterator_base._M_p = local_108;
      local_f8.super__Bit_iterator_base._M_offset = local_100;
      ptVar10[-1]._M_id._M_thread = 0x1131bd;
      std::_Bit_const_iterator::_Bit_const_iterator((_Bit_const_iterator *)local_e8,&local_f8);
      pvVar1 = local_190 + local_d8;
      ptVar10[-1]._M_id._M_thread = 0x1131da;
      iVar12 = std::vector<bool,_std::allocator<bool>_>::begin(pvVar1);
      local_128 = iVar12.super__Bit_iterator_base._M_p;
      local_120 = iVar12.super__Bit_iterator_base._M_offset;
      pvVar1 = local_190 + local_d8;
      local_118 = local_128;
      local_110 = local_120;
      ptVar10[-1]._M_id._M_thread = 0x11321f;
      iVar12 = std::vector<bool,_std::allocator<bool>_>::end(pvVar1);
      auVar5 = local_e8;
      pvVar4 = local_168;
      local_148 = iVar12.super__Bit_iterator_base._M_p;
      local_140 = iVar12.super__Bit_iterator_base._M_offset;
      uStack_130 = local_140;
      local_138 = local_148;
      __first.super__Bit_iterator_base._M_offset = local_110;
      __first.super__Bit_iterator_base._M_p = local_118;
      nVar3 = CONCAT44(uStack_12c,local_140);
      ptVar10[-2]._M_id._M_thread = (native_handle_type)local_148;
      ptVar10[-1]._M_id._M_thread = nVar3;
      ptVar10[-3]._M_id._M_thread = 0x11327e;
      auVar6 = local_e8;
      __first.super__Bit_iterator_base._12_4_ = 0;
      __position.super__Bit_iterator_base._12_4_ = 0;
      local_e8._0_8_ = auVar5._0_8_;
      local_e8._8_4_ = auVar5._8_4_;
      __position.super__Bit_iterator_base._M_p = (_Bit_type *)local_e8._0_8_;
      __position.super__Bit_iterator_base._M_offset = local_e8._8_4_;
      local_e8 = auVar6;
      iVar13 = std::vector<bool,std::allocator<bool>>::insert<std::_Bit_iterator,void>
                         (pvVar4,__position,__first,*(_Bit_iterator_base *)(ptVar10 + -2));
      local_208 = iVar13.super__Bit_iterator_base._M_p;
      local_20c = iVar13.super__Bit_iterator_base._M_offset;
      local_158 = local_208;
      local_150 = local_20c;
    }
    ptVar10[-1]._M_id._M_thread = 0x1132e6;
    local_20d = std::ios::eof();
    if ((local_20d & 1) == 0) {
      local_15c = 4;
    }
    else {
      local_15c = 5;
    }
    local_218 = local_1d8 + local_1e0;
    if (local_1d8 != local_218) {
      do {
        ptVar11 = local_218 + -1;
        local_220 = ptVar11;
        ptVar10[-1]._M_id._M_thread = 0x11334b;
        std::thread::~thread(ptVar11);
        local_218 = local_220;
      } while (local_220 != local_1d8);
    }
  } while (local_15c == 4);
  local_15c = 1;
  local_238 = local_190 + local_198;
  if (local_190 != local_238) {
    do {
      pvVar9 = local_238 + -1;
      auStack_258._24_8_ = pvVar9;
      *(undefined8 *)(auStack_258 + lVar2 + -8) = 0x11341f;
      std::vector<bool,_std::allocator<bool>_>::~vector(pvVar9);
      local_238 = (vector<bool,_std::allocator<bool>_> *)auStack_258._24_8_;
    } while ((vector<bool,_std::allocator<bool>_> *)auStack_258._24_8_ != local_190);
  }
  _Stack_268._8_8_ = 0x1134b4;
  std::__cxx11::string::~string((string *)&line_counter);
  return local_178;
}

Assistant:

std::vector<bool> xcardMT::validateFromFile(std::ifstream &fp)
{

    //declare buf to store string from file!
    std::string buf;

    //to join indv. results from threads.
    std::vector<bool> final_result;

    //counter vars
    int line_counter = 0;

    //initial line counting
    while (getline(fp, buf))
    {
        line_counter++;
    }

    //clear and reset file
    fp.clear();
    fp.seekg(0, std::ios::beg);

    //init. threads and results vector.

    //if max_threads < 0 set to no of cpu of system.
    if (this->max_threads <= 0){
        this->max_threads = std::thread::hardware_concurrency();
    }


    std::vector<bool> results[this->max_threads];

    if (this->debug)
    {
        std::cout << "[DEBUG] TotalLines=" << line_counter << std::endl;
        std::cout << "[DEBUG] max_threads=" << this->max_threads << std::endl;
    }


    while(true){

        //set max_threads and per_thread;
        long int per_thread = line_counter / this->max_threads;

        if (per_thread <= this->max_threads){
            this->max_threads = 1;
            per_thread = line_counter;
        }

        std::thread threads[this->max_threads];
        
        //debug
        //std::cout << "per_thread= " << per_thread << " max_threads=" << this->max_threads << std::endl;

        for (size_t thread_id = 0; thread_id < this->max_threads; thread_id++)
        {
            //declare storage
            std::vector<std::string> card_storage;

            int pt_counter = 0;

            //get lines and store in storage (check for eof)
        while (pt_counter < per_thread && !fp.eof())
        {
            getline(fp, buf);
            card_storage.push_back(buf);
            pt_counter++;
        }

        //dispatch
        threads[thread_id] = std::thread(&xcardMT::runner, this, card_storage, &results[thread_id]);
        line_counter -= pt_counter;

        }

        //join and add result to final_result
        for (size_t i = 0; i < this->max_threads; i++)
        {
            threads[i].join();
            final_result.insert(final_result.end(), results[i].begin(), results[i].end());
        }
        

        //if not eof - continue
        if(fp.eof()){
            break;
        }else{
            continue;
        }


    } //end while

    return final_result;
}